

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O1

void __thiscall QtMWidgets::ToolBarLayout::setGeometry(ToolBarLayout *this,QRect *rect)

{
  Orientation OVar1;
  QLayoutItem *pQVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  int local_98;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  uint local_48;
  int local_44;
  ulong local_40;
  QRect *local_38;
  
  QLayout::setGeometry((QRect *)this);
  auVar20 = QLayout::contentsMargins();
  if ((((this->buttons).d.size != 0) && (this->left != (QWidgetItem *)0x0)) &&
     (this->right != (QWidgetItem *)0x0)) {
    iVar17 = rect->x1 + auVar20._0_4_;
    uVar19 = auVar20._4_4_ + rect->y1;
    iVar16 = rect->x2;
    iVar11 = rect->y2;
    if (this->offset < 0) {
      this->offset = 0;
    }
    iVar16 = iVar16 - auVar20._8_4_;
    uVar18 = iVar11 - auVar20._12_4_;
    uVar9 = (**(code **)(*(long *)this->left + 0x10))();
    local_98 = (int)(uVar9 >> 0x20);
    uVar10 = (**(code **)(*(long *)this->right + 0x10))();
    if (this->orient == Horizontal) {
      iVar11 = (uVar18 - uVar19) - local_98;
      uVar14 = (ulong)(((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) + uVar19);
      iVar11 = iVar17;
    }
    else {
      iVar11 = (iVar16 - iVar17) - (int)uVar9;
      iVar11 = ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) + iVar17;
      uVar14 = (ulong)uVar19;
    }
    local_44 = this->offset;
    local_60 = (ulong)uVar18;
    local_58 = uVar9;
    local_38 = rect;
    if (local_44 < 1) {
      local_78 = 0;
      iStack_74 = 0;
      iStack_70 = -1;
      iStack_6c = -1;
      (**(code **)(*(long *)this->left + 0x30))();
      local_58 = 0;
      local_98 = 0;
      iVar11 = iVar17;
      local_68 = (ulong)uVar19;
    }
    else {
      iVar6 = (int)uVar14;
      iStack_70 = (int)uVar9 + iVar11 + -1;
      iStack_6c = local_98 + -1 + iVar6;
      local_78 = iVar11;
      iStack_74 = iVar6;
      (**(code **)(*(long *)this->left + 0x30))();
      OVar1 = this->orient;
      iVar5 = (**(code **)(*(long *)this + 0x60))(this);
      if (OVar1 == Horizontal) {
        iVar11 = iVar11 + (int)local_58 + iVar5;
        local_68 = uVar14;
      }
      else {
        local_68 = (ulong)(uint)(iVar6 + local_98 + iVar5);
      }
    }
    local_40 = (**(code **)(*(long *)*(this->buttons).d.ptr + 0x10))();
    local_50 = local_40 >> 0x20;
    iVar5 = (int)(local_40 >> 0x20);
    if (this->orient == Horizontal) {
      iVar5 = (int)local_40;
    }
    iVar6 = (**(code **)(*(long *)this + 0x60))(this);
    iVar6 = iVar6 + iVar5;
    iVar5 = this->offset;
    uVar9 = 0;
    if (iVar6 <= iVar5) {
      uVar9 = 0;
      do {
        pQVar2 = (this->buttons).d.ptr[uVar9];
        local_78 = 0;
        iStack_74 = 0;
        iStack_70 = -1;
        iStack_6c = -1;
        (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_78);
        uVar9 = uVar9 + 1;
        iVar5 = iVar5 - iVar6;
      } while (iVar6 <= iVar5);
    }
    uVar18 = (uint)uVar9;
    iVar5 = this->offset % iVar6;
    if (this->orient == Horizontal) {
      iVar5 = iVar5 + iVar11;
      iVar12 = (iVar16 - ((int)local_58 + iVar17)) + 1;
      iVar12 = iVar12 - iVar12 % iVar6;
      iVar11 = (int)local_60 - ((int)local_50 + uVar19);
      iVar11 = ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) + uVar19;
      iVar8 = iVar5;
    }
    else {
      iVar5 = iVar5 + (int)local_68;
      iVar12 = ((int)local_60 - (local_98 + uVar19)) + 1;
      iVar12 = iVar12 - iVar12 % iVar6;
      iVar11 = iVar16 - ((int)local_40 + iVar17);
      iVar8 = ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) + iVar17;
      iVar11 = iVar5;
    }
    iVar7 = spaceNeeded(this);
    OVar1 = this->orient;
    local_48 = iVar16 - iVar17;
    iVar13 = (int)local_60;
    local_68 = (ulong)(iVar13 - uVar19);
    uVar15 = iVar13 - uVar19;
    if (OVar1 == Horizontal) {
      uVar15 = local_48;
    }
    if (iVar7 < (int)(uVar15 + 1)) {
      uVar15 = (this->align).i;
      if (((OVar1 == Horizontal & (byte)((uVar15 & 2) >> 1)) == 0) &&
         ((OVar1 == Vertical & (byte)((uVar15 & 0x40) >> 6)) == 0)) {
        if ((uVar15 & 0x84) != 0) {
          if (OVar1 == Horizontal) {
            iVar7 = iVar16 - (iVar7 + iVar17);
            iVar8 = ((iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1) + iVar8;
          }
          else {
            iVar13 = iVar13 - (iVar7 + uVar19);
            iVar11 = ((iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1) + iVar11;
          }
        }
      }
      else if (OVar1 == Horizontal) {
        iVar8 = ((iVar8 + iVar16) - (iVar7 + iVar17)) + 1;
      }
      else {
        iVar11 = ((iVar11 + iVar13) - (iVar7 + uVar19)) + 1;
      }
    }
    iVar7 = 0;
    if ((iVar5 < iVar12) && ((long)(uVar9 & 0xffffffff) < (this->buttons).d.size)) {
      local_58 = (ulong)((int)local_40 - 1);
      local_50 = (ulong)((int)local_50 - 1);
      uVar9 = uVar9 & 0xffffffff;
      do {
        uVar14 = uVar9;
        iVar5 = iVar5 + iVar6;
        pQVar2 = (this->buttons).d.ptr[uVar14];
        iStack_70 = (int)local_58 + iVar8;
        iStack_6c = (int)local_50 + iVar11;
        local_78 = iVar8;
        iStack_74 = iVar11;
        (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_78);
        iVar13 = iVar8 + iVar6;
        iVar7 = iVar6 + iVar11;
        if (iVar12 <= iVar5) break;
        iVar4 = iVar7;
        if (this->orient == Horizontal) {
          iVar8 = iVar13;
          iVar4 = iVar11;
        }
        iVar11 = iVar4;
        uVar9 = uVar14 + 1;
      } while ((long)(uVar14 + 1) < (this->buttons).d.size);
      if (this->orient == Horizontal) {
        iVar7 = iVar13;
      }
      uVar18 = (int)uVar14 + 1;
    }
    uVar9 = (ulong)uVar18;
    lVar3 = (this->buttons).d.size;
    local_50 = CONCAT44(local_50._4_4_,iVar7);
    if ((long)uVar9 < lVar3) {
      iVar11 = (int)uVar10;
      iVar8 = (int)((ulong)uVar10 >> 0x20);
      if (this->orient == Horizontal) {
        iVar7 = (iVar16 + 1) - iVar17;
        iVar16 = iVar7 - iVar11;
        iVar12 = (int)local_60 - (uVar19 + iVar8);
        iVar12 = (iVar12 - (iVar12 + 1 >> 0x1f)) + 1 >> 1;
      }
      else {
        iVar16 = ((iVar16 + 1) - (iVar17 + iVar11)) / 2;
        iVar7 = (int)local_68 + 1;
        iVar12 = iVar7 - iVar8;
      }
      if (iVar7 < iVar5) {
        local_78 = 0;
        iStack_74 = 0;
        iStack_70 = 0xffffffff;
        iStack_6c = 0xffffffff;
        (**(code **)(*(long *)(this->buttons).d.ptr[uVar9 - 1] + 0x30))();
      }
      local_78 = iVar16 + iVar17;
      iStack_74 = iVar12 + uVar19;
      iStack_70 = iVar11 + -1 + local_78;
      iStack_6c = iVar8 + iStack_74 + -1;
      (**(code **)(*(long *)this->right + 0x30))();
      (**(code **)(*(long *)this->right + 0x68))();
      QWidget::raise();
    }
    else {
      local_78 = 0;
      iStack_74 = 0;
      iStack_70 = -1;
      iStack_6c = -1;
      (**(code **)(*(long *)this->right + 0x30))();
    }
    if ((long)uVar9 < (this->buttons).d.size) {
      if ((long)uVar9 < (this->buttons).d.size) {
        do {
          pQVar2 = (this->buttons).d.ptr[uVar9];
          local_78 = 0;
          iStack_74 = 0;
          iStack_70 = -1;
          iStack_6c = -1;
          (**(code **)(*(long *)pQVar2 + 0x30))(pQVar2,&local_78);
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (this->buttons).d.size);
      }
    }
    else if (((lVar3 <= (long)uVar9) && (0 < local_44)) && (0 < this->offset)) {
      uVar19 = (uint)local_68;
      if (this->orient == Horizontal) {
        uVar19 = local_48;
      }
      if ((int)local_50 + iVar6 / 2 <= (int)(uVar19 + 1)) {
        this->offset = 0;
        (**(code **)(*(long *)this + 0xa0))(this,local_38);
      }
    }
    (**(code **)(*(long *)this->left + 0x68))();
    QWidget::raise();
  }
  return;
}

Assistant:

void
ToolBarLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int x = r.x();
	int y = r.y();

	if( !buttons.isEmpty() && left && right )
	{
		if( offset < 0 )
			offset = 0;

		QSize leftSize = left->sizeHint();
		const QSize rightSize = right->sizeHint();

		if( orient == Qt::Horizontal )
			y = r.y() + ( r.height() - leftSize.height() ) / 2;
		else
			x = r.x() + ( r.width() - leftSize.width() ) / 2;

		// Set left arrow geometry.
		bool leftArrowShown = false;

		if( offset > 0 )
		{
			leftArrowShown = true;

			left->setGeometry( QRect( x, y, leftSize.width(), leftSize.height() ) );

			if( orient == Qt::Horizontal )
				x += leftSize.width() + spacing();
			else
				y += leftSize.height() + spacing();
		}
		else
		{
			left->setGeometry( QRect( 0, 0, 0, 0 ) );
			leftSize = QSize( 0, 0 );

			x = r.x();
			y = r.y();
		}

		const QSize buttonSize = buttons.at( 0 )->sizeHint();
		const int dim = ( orient == Qt::Horizontal ?
			buttonSize.width() : buttonSize.height() ) + spacing();
		int i = 0;
		int tmpOffset = offset;

		// Hide buttons that left on left arrow.
		while( tmpOffset >= dim )
		{
			buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );

			++i;
			tmpOffset -= dim;
		}

		int stop = 0;

		// Show visible buttons.
		if( orient == Qt::Horizontal )
		{
			x += offset % dim;
			tmpOffset = x;
			stop = ( r.width() - leftSize.width() ) / dim * dim;
			y = r.y() + ( r.height() - buttonSize.height() ) / 2;
		}
		else
		{
			y += offset % dim;
			tmpOffset = y;
			stop = ( r.height() - leftSize.height() ) / dim * dim;
			x = r.x() + ( r.width() - buttonSize.width() ) / 2;
		}

		int space = spaceNeeded();

		if( space < ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			if( ( ( align & Qt::AlignRight ) && orient == Qt::Horizontal )
				| ( ( align & Qt::AlignBottom ) && orient == Qt::Vertical  ) )
			{
				if( orient == Qt::Horizontal )
					x += r.width() - space;
				else
					y += r.height() - space;
			}
			else if( align & Qt::AlignCenter )
			{
				if( orient == Qt::Horizontal )
					x += ( r.width() - space ) / 2;
				else
					y += ( r.height() - space ) / 2;
			}
		}

		space = 0;

		while( tmpOffset < stop && i < buttons.size() )
		{
			buttons.at( i )->setGeometry( QRect( x, y,
				buttonSize.width(), buttonSize.height() ) );

			if( orient == Qt::Horizontal )
			{
				x += dim;
				space = x;
			}
			else
			{
				y += dim;
				space = y;
			}

			tmpOffset += dim;
			++i;
		}

		// Set right arrow geometry.
		bool rightArrowShown = false;

		if( i < buttons.size() )
		{
			if( orient == Qt::Horizontal )
			{
				x = r.width() - rightSize.width() + r.x();
				y = r.y() + ( r.height() - rightSize.height() ) / 2;

				if( tmpOffset > r.width() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}
			else
			{
				x = r.x() + ( r.width() - rightSize.width() ) / 2;
				y = r.height() - rightSize.height() + r.y();

				if( tmpOffset > r.height() )
					buttons.at( i - 1 )->setGeometry( QRect( 0, 0, 0, 0 ) );
			}

			right->setGeometry( QRect( x, y,
				rightSize.width(), rightSize.height() ) );

			right->widget()->raise();

			rightArrowShown = true;
		}
		else
		{
			right->setGeometry( QRect( 0, 0, 0, 0 ) );
		}

		// Hide buttons that right on right arrow.
		if( i < buttons.size() )
		{
			for( ; i < buttons.size(); ++i )
				buttons.at( i )->setGeometry( QRect( 0, 0, 0, 0 ) );
		}
		else if( offset > 0 && leftArrowShown &&
			!rightArrowShown &&
			space + dim / 2 <= ( orient == Qt::Horizontal ? r.width() : r.height() ) )
		{
			offset = 0;
			setGeometry( rect );
		}

		left->widget()->raise();
	}
}